

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmberImproperTorsionType.hpp
# Opt level: O2

ostream * OpenMD::operator<<(ostream *os,AmberImproperTorsionType *ott)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"This AmberImproperTorsionType has below form:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<double>(ott->v2_);
  poVar1 = std::operator<<(poVar1,"/2*(1-cos(2*(phi-phi0)))");
  std::endl<char,std::char_traits<char>>(poVar1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, AmberImproperTorsionType& ott) {
    os << "This AmberImproperTorsionType has below form:" << std::endl;
    os << ott.v2_ << "/2*(1-cos(2*(phi-phi0)))" << std::endl;
    return os;
  }